

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-time.c
# Opt level: O1

int run_test_loop_backend_timeout(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_loop_t *puVar2;
  uv_timer_t timer;
  
  loop = uv_default_loop();
  puVar2 = loop;
  iVar1 = uv_timer_init(loop,(uv_timer_t *)&stack0xffffffffffffff60);
  if (iVar1 == 0) {
    puVar2 = loop;
    iVar1 = uv_loop_alive(loop);
    if (iVar1 != 0) goto LAB_00161833;
    puVar2 = loop;
    iVar1 = uv_backend_timeout(loop);
    if (iVar1 != 0) goto LAB_00161838;
    puVar2 = (uv_loop_t *)&stack0xffffffffffffff60;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,cb,1000,0);
    if (iVar1 != 0) goto LAB_0016183d;
    puVar2 = loop;
    iVar1 = uv_backend_timeout(loop);
    if (iVar1 < 0x65) goto LAB_00161842;
    puVar2 = loop;
    iVar1 = uv_backend_timeout(loop);
    if (1000 < iVar1) goto LAB_00161847;
    puVar2 = loop;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016184c;
    iVar1 = uv_backend_timeout(loop);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00161856;
    }
  }
  else {
    run_test_loop_backend_timeout_cold_1();
LAB_00161833:
    run_test_loop_backend_timeout_cold_2();
LAB_00161838:
    run_test_loop_backend_timeout_cold_3();
LAB_0016183d:
    run_test_loop_backend_timeout_cold_4();
LAB_00161842:
    run_test_loop_backend_timeout_cold_5();
LAB_00161847:
    run_test_loop_backend_timeout_cold_6();
LAB_0016184c:
    loop = puVar2;
    run_test_loop_backend_timeout_cold_7();
  }
  run_test_loop_backend_timeout_cold_8();
LAB_00161856:
  run_test_loop_backend_timeout_cold_9();
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(loop_backend_timeout) {
  uv_loop_t *loop = uv_default_loop();
  uv_timer_t timer;
  int r;

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  ASSERT(!uv_loop_alive(loop));
  ASSERT(uv_backend_timeout(loop) == 0);

  r = uv_timer_start(&timer, cb, 1000, 0); /* 1 sec */
  ASSERT(r == 0);
  ASSERT(uv_backend_timeout(loop) > 100); /* 0.1 sec */
  ASSERT(uv_backend_timeout(loop) <= 1000); /* 1 sec */

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(uv_backend_timeout(loop) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}